

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawData::ScaleClipRects(ImDrawData *this,ImVec2 *fb_scale)

{
  ImDrawList *this_00;
  ImDrawCmd *pIVar1;
  int cmd_i;
  int i_00;
  int i;
  long lVar2;
  float fVar3;
  float fVar4;
  
  for (lVar2 = 0; lVar2 < this->CmdListsCount; lVar2 = lVar2 + 1) {
    this_00 = this->CmdLists[lVar2];
    for (i_00 = 0; i_00 < (this_00->CmdBuffer).Size; i_00 = i_00 + 1) {
      pIVar1 = ImVector<ImDrawCmd>::operator[](&this_00->CmdBuffer,i_00);
      fVar3 = (*fb_scale).x;
      fVar4 = (*fb_scale).y;
      (pIVar1->ClipRect).x = (pIVar1->ClipRect).x * fVar3;
      (pIVar1->ClipRect).y = (pIVar1->ClipRect).y * fVar4;
      (pIVar1->ClipRect).z = (pIVar1->ClipRect).z * fVar3;
      (pIVar1->ClipRect).w = (pIVar1->ClipRect).w * fVar4;
    }
  }
  return;
}

Assistant:

void ImDrawData::ScaleClipRects(const ImVec2& fb_scale)
{
    for (int i = 0; i < CmdListsCount; i++)
    {
        ImDrawList* cmd_list = CmdLists[i];
        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            ImDrawCmd* cmd = &cmd_list->CmdBuffer[cmd_i];
            cmd->ClipRect = ImVec4(cmd->ClipRect.x * fb_scale.x, cmd->ClipRect.y * fb_scale.y, cmd->ClipRect.z * fb_scale.x, cmd->ClipRect.w * fb_scale.y);
        }
    }
}